

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IntersectClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IntersectClauseSyntax,slang::parsing::Token&,slang::syntax::OpenRangeListSyntax&>
          (BumpAllocator *this,Token *args,OpenRangeListSyntax *args_1)

{
  Token intersect;
  IntersectClauseSyntax *this_00;
  OpenRangeListSyntax *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (IntersectClauseSyntax *)allocate(this,0x28,8);
  intersect.kind = args->kind;
  intersect._2_1_ = args->field_0x2;
  intersect.numFlags.raw = (args->numFlags).raw;
  intersect.rawLen = args->rawLen;
  intersect.info = args->info;
  slang::syntax::IntersectClauseSyntax::IntersectClauseSyntax(this_00,intersect,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }